

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Interpolater.cpp
# Opt level: O3

void __thiscall
amrex::CellConservativeProtected::protect
          (CellConservativeProtected *this,FArrayBox *param_1,int param_2,FArrayBox *fine,
          int param_4,FArrayBox *fine_state,int param_6,int ncomp,Box *fine_region,IntVect *ratio,
          Geometry *crse_geom,Geometry *fine_geom,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *param_12,RunOn runon)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  double *pdVar10;
  double *pdVar11;
  int iVar12;
  ulong uVar13;
  undefined8 uVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  double *pdVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  long lVar31;
  int iVar32;
  long lVar33;
  long lVar34;
  int k;
  int iVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  double *pdVar39;
  int iVar40;
  undefined4 in_register_00000084;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  long lVar49;
  long lVar50;
  int iVar51;
  int iVar52;
  long lVar53;
  double *pdVar54;
  long lVar55;
  long lVar56;
  int iVar57;
  long lVar58;
  long lVar59;
  bool bVar60;
  ulong uVar61;
  ulong uVar62;
  ulong uVar63;
  double dVar64;
  Real negVal;
  double dVar65;
  double dVar66;
  Real posVal;
  double dVar67;
  double dVar68;
  Box crse_bx;
  Box lhs;
  double *local_228;
  double *local_220;
  long local_190;
  long local_188;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  ulong local_58;
  int iStack_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  int local_44;
  undefined4 uStack_40;
  
  uVar61 = *(ulong *)(fine_region->smallend).vect;
  uVar13 = *(ulong *)(fine_region->bigend).vect;
  uVar14 = *(undefined8 *)((fine_region->bigend).vect + 2);
  iStack_50 = (int)*(undefined8 *)((fine_region->smallend).vect + 2);
  uVar63 = *(ulong *)(fine->super_BaseFab<double>).domain.smallend.vect;
  uVar62 = CONCAT44(-(uint)((int)(uVar63 >> 0x20) < (int)(uVar61 >> 0x20)),
                    -(uint)((int)uVar63 < (int)uVar61));
  local_58 = ~uVar62 & uVar63 | uVar61 & uVar62;
  iVar23 = (fine->super_BaseFab<double>).domain.smallend.vect[2];
  if (iVar23 < iStack_50) {
    iVar23 = iStack_50;
  }
  uVar63 = *(ulong *)(fine->super_BaseFab<double>).domain.bigend.vect;
  uVar61 = CONCAT44(-(uint)((int)(uVar13 >> 0x20) < (int)(uVar63 >> 0x20)),
                    -(uint)((int)uVar13 < (int)uVar63));
  uVar63 = ~uVar61 & uVar63 | uVar13 & uVar61;
  uStack_4c = (undefined4)uVar63;
  uStack_48 = (undefined4)(uVar63 >> 0x20);
  local_44 = (int)uVar14;
  iVar24 = (fine->super_BaseFab<double>).domain.bigend.vect[2];
  if (local_44 < iVar24) {
    iVar24 = local_44;
  }
  _local_44 = CONCAT44((int)((ulong)uVar14 >> 0x20),iVar24);
  iStack_50 = iVar23;
  (*(this->super_CellConservativeLinear).super_Interpolater.super_InterpBase._vptr_InterpBase[3])
            (&local_74,this,&local_58,ratio,CONCAT44(in_register_00000084,param_4));
  local_6c = local_6c + 1;
  if (local_6c < local_60) {
    pdVar10 = (fine->super_BaseFab<double>).dptr;
    iVar24 = (fine->super_BaseFab<double>).domain.smallend.vect[0];
    lVar41 = (long)iVar24;
    iVar1 = (fine->super_BaseFab<double>).domain.smallend.vect[2];
    lVar49 = (long)iVar1;
    iVar2 = (fine->super_BaseFab<double>).domain.bigend.vect[2];
    lVar44 = (long)((iVar2 - iVar1) + 1);
    pdVar11 = (fine_state->super_BaseFab<double>).dptr;
    iVar3 = (fine_state->super_BaseFab<double>).domain.smallend.vect[0];
    iVar23 = (fine_state->super_BaseFab<double>).domain.smallend.vect[2];
    lVar42 = lVar44 * 8 + lVar49 * -8;
    lVar36 = (long)(((fine_state->super_BaseFab<double>).domain.bigend.vect[2] - iVar23) + 1);
    lVar43 = lVar36 * 8 + (long)iVar23 * -8;
    local_70 = local_70 + 1;
    iVar4 = (fine->super_BaseFab<double>).domain.smallend.vect[1];
    lVar50 = (long)iVar4;
    iVar5 = (fine->super_BaseFab<double>).domain.bigend.vect[0];
    iVar6 = (fine->super_BaseFab<double>).domain.bigend.vect[1];
    lVar33 = (long)((iVar5 - iVar24) + 1);
    lVar25 = (long)((iVar6 - iVar4) + 1);
    lVar53 = lVar25 * lVar33;
    iVar46 = (fine_state->super_BaseFab<double>).domain.smallend.vect[1];
    lVar34 = (long)(((fine_state->super_BaseFab<double>).domain.bigend.vect[0] - iVar3) + 1);
    lVar26 = (long)(((fine_state->super_BaseFab<double>).domain.bigend.vect[1] - iVar46) + 1);
    iVar7 = ratio->vect[0];
    iVar8 = ratio->vect[1];
    iVar9 = ratio->vect[2];
    iVar23 = local_74 + 1;
    iVar45 = iVar9 * local_6c;
    lVar44 = lVar44 * lVar53;
    lVar58 = (long)iVar46 * -8;
    lVar27 = lVar26 * lVar34;
    lVar36 = lVar36 * lVar27;
    do {
      lVar16 = (long)iVar45;
      if (iVar45 < lVar49) {
        lVar16 = lVar49;
      }
      if (local_70 < local_64) {
        iVar46 = local_6c * iVar9;
        iVar51 = iVar1;
        if (iVar1 < iVar46) {
          iVar51 = iVar46;
        }
        iVar46 = iVar46 + iVar9 + -1;
        if (iVar2 < iVar46) {
          iVar46 = iVar2;
        }
        iVar30 = iVar8 * local_70;
        iVar15 = local_70;
        do {
          lVar17 = (long)iVar30;
          if (iVar30 < lVar50) {
            lVar17 = lVar50;
          }
          if (iVar23 < local_68) {
            iVar47 = iVar15 * iVar8;
            iVar52 = iVar4;
            if (iVar4 < iVar47) {
              iVar52 = iVar47;
            }
            iVar47 = iVar47 + iVar8 + -1;
            if (iVar6 < iVar47) {
              iVar47 = iVar6;
            }
            iVar32 = iVar47 + 1;
            lVar18 = (long)iVar52;
            lVar19 = lVar50 * -8 + lVar17 * 8;
            lVar37 = lVar17 * 8 + lVar58;
            iVar29 = iVar7 * iVar23;
            iVar12 = iVar23;
            iVar35 = (local_74 + 2) * iVar7 + -1;
            do {
              lVar20 = (long)iVar29;
              if (iVar29 < lVar41) {
                lVar20 = lVar41;
              }
              iVar48 = iVar35;
              if (iVar5 < iVar35) {
                iVar48 = iVar5;
              }
              iVar40 = iVar12 * iVar7;
              iVar57 = iVar24;
              if (iVar24 < iVar40) {
                iVar57 = iVar40;
              }
              iVar40 = iVar40 + iVar7 + -1;
              if (iVar5 < iVar40) {
                iVar40 = iVar5;
              }
              if (2 < ncomp) {
                iVar48 = (iVar48 - (int)lVar20) + 1;
                local_220 = pdVar10 + (lVar20 - lVar41);
                local_228 = pdVar11 + (lVar20 - iVar3);
                local_188 = (long)pdVar10 +
                            lVar20 * 8 +
                            ((lVar42 + lVar16 * 8) * lVar25 + lVar50 * -8 + lVar17 * 8) * lVar33 +
                            lVar41 * -8;
                local_190 = (long)pdVar11 +
                            lVar20 * 8 +
                            ((lVar43 + lVar16 * 8) * lVar26 + lVar58 + lVar17 * 8) * lVar34 +
                            (long)iVar3 * -8;
                dVar64 = (double)(((iVar40 - iVar57) + 1) *
                                 (iVar32 - iVar52) * ((iVar46 - iVar51) + 1));
                uVar63 = 1;
                do {
                  if (iVar51 <= iVar46) {
                    bVar60 = false;
                    lVar59 = local_190;
                    lVar55 = local_188;
                    iVar28 = iVar51;
                    do {
                      lVar21 = lVar55;
                      lVar31 = lVar59;
                      lVar56 = lVar18;
                      if (iVar52 <= iVar47) {
                        do {
                          if (iVar57 <= iVar40) {
                            lVar38 = 0;
                            do {
                              bVar60 = (bool)(bVar60 | *(double *)(lVar31 + lVar38 * 8) +
                                                       *(double *)(lVar21 + lVar38 * 8) < 0.0);
                              lVar38 = lVar38 + 1;
                            } while (iVar48 != (int)lVar38);
                          }
                          lVar56 = lVar56 + 1;
                          lVar21 = lVar21 + lVar33 * 8;
                          lVar31 = lVar31 + lVar34 * 8;
                        } while (iVar32 != (int)lVar56);
                      }
                      iVar28 = iVar28 + 1;
                      lVar55 = lVar55 + lVar53 * 8;
                      lVar59 = lVar59 + lVar27 * 8;
                    } while (iVar46 + 1 != iVar28);
                    if (bVar60) {
                      dVar66 = 0.0;
                      dVar67 = 0.0;
                      dVar65 = 0.0;
                      lVar59 = local_190;
                      lVar55 = local_188;
                      iVar28 = iVar51;
                      do {
                        lVar21 = lVar18;
                        lVar31 = lVar55;
                        lVar56 = lVar59;
                        if (iVar52 <= iVar47) {
                          do {
                            if (iVar57 <= iVar40) {
                              lVar38 = 0;
                              do {
                                dVar68 = *(double *)(lVar56 + lVar38 * 8);
                                if (dVar68 <= 0.0) {
                                  dVar67 = dVar67 + dVar68;
                                }
                                dVar65 = dVar65 + *(double *)(lVar31 + lVar38 * 8);
                                dVar66 = (double)(~-(ulong)(0.0 < dVar68) & (ulong)dVar66 |
                                                 (ulong)(dVar66 + dVar68) & -(ulong)(0.0 < dVar68));
                                lVar38 = lVar38 + 1;
                              } while (iVar48 != (int)lVar38);
                            }
                            lVar21 = lVar21 + 1;
                            lVar56 = lVar56 + lVar34 * 8;
                            lVar31 = lVar31 + lVar33 * 8;
                          } while (iVar32 != (int)lVar21);
                        }
                        iVar28 = iVar28 + 1;
                        lVar59 = lVar59 + lVar27 * 8;
                        lVar55 = lVar55 + lVar53 * 8;
                      } while (iVar46 + 1 != iVar28);
                      if (dVar65 <= 0.0) {
LAB_004a64af:
                        if (dVar65 < 0.0) {
                          if (ABS(dVar65) <= dVar66) {
                            if (ABS(dVar65) < dVar66) {
                              dVar68 = dVar67 + dVar66 + dVar65;
                              if (dVar68 <= 0.0) {
                                if (dVar68 < 0.0) {
                                  iVar28 = iVar51;
                                  do {
                                    if (iVar52 <= iVar47) {
                                      pdVar22 = (double *)
                                                ((((long)iVar28 * 8 + lVar42) * lVar25 + lVar19) *
                                                 lVar33 + (long)local_220);
                                      pdVar54 = (double *)
                                                ((((long)iVar28 * 8 + lVar43) * lVar26 + lVar37) *
                                                 lVar34 + (long)local_228);
                                      lVar59 = lVar18;
                                      do {
                                        if (iVar57 <= iVar40) {
                                          lVar55 = 0;
                                          do {
                                            dVar68 = pdVar54[lVar55];
                                            uVar61 = -(ulong)(-dVar68 < dVar68);
                                            pdVar22[lVar55] =
                                                 (double)(~uVar61 & (ulong)(((dVar65 + dVar66) /
                                                                            dVar67) * dVar68) |
                                                         (ulong)-dVar68 & uVar61);
                                            lVar55 = lVar55 + 1;
                                          } while (iVar48 != (int)lVar55);
                                        }
                                        lVar59 = lVar59 + 1;
                                        pdVar22 = pdVar22 + lVar33;
                                        pdVar54 = pdVar54 + lVar34;
                                      } while (iVar32 != (int)lVar59);
                                    }
                                    bVar60 = iVar28 != iVar46;
                                    iVar28 = iVar28 + 1;
                                  } while (bVar60);
                                }
                              }
                              else {
                                iVar28 = iVar51;
                                do {
                                  if (iVar52 <= iVar47) {
                                    pdVar22 = (double *)
                                              ((((long)iVar28 * 8 + lVar42) * lVar25 + lVar19) *
                                               lVar33 + (long)local_220);
                                    pdVar54 = (double *)
                                              ((((long)iVar28 * 8 + lVar43) * lVar26 + lVar37) *
                                               lVar34 + (long)local_228);
                                    lVar59 = lVar18;
                                    do {
                                      if (iVar57 <= iVar40) {
                                        lVar55 = 0;
                                        do {
                                          dVar68 = pdVar54[lVar55];
                                          uVar61 = -(ulong)(dVar68 < -dVar68);
                                          pdVar22[lVar55] =
                                               (double)(~uVar61 & (ulong)(((dVar65 + dVar67) /
                                                                          dVar66) * dVar68) |
                                                       (ulong)-dVar68 & uVar61);
                                          lVar55 = lVar55 + 1;
                                        } while (iVar48 != (int)lVar55);
                                      }
                                      lVar59 = lVar59 + 1;
                                      pdVar22 = pdVar22 + lVar33;
                                      pdVar54 = pdVar54 + lVar34;
                                    } while (iVar32 != (int)lVar59);
                                  }
                                  bVar60 = iVar28 != iVar46;
                                  iVar28 = iVar28 + 1;
                                } while (bVar60);
                              }
                            }
                          }
                          else {
                            iVar28 = iVar51;
                            do {
                              if (iVar52 <= iVar47) {
                                pdVar22 = (double *)
                                          ((((long)iVar28 * 8 + lVar42) * lVar25 + lVar19) * lVar33
                                          + (long)local_220);
                                pdVar54 = (double *)
                                          ((((long)iVar28 * 8 + lVar43) * lVar26 + lVar37) * lVar34
                                          + (long)local_228);
                                lVar59 = lVar18;
                                do {
                                  if (iVar57 <= iVar40) {
                                    lVar55 = 0;
                                    do {
                                      pdVar22[lVar55] =
                                           (dVar65 + dVar67 + dVar66) / dVar64 - pdVar54[lVar55];
                                      lVar55 = lVar55 + 1;
                                    } while (iVar48 != (int)lVar55);
                                  }
                                  lVar59 = lVar59 + 1;
                                  pdVar22 = pdVar22 + lVar33;
                                  pdVar54 = pdVar54 + lVar34;
                                } while (iVar32 != (int)lVar59);
                              }
                              bVar60 = iVar28 != iVar46;
                              iVar28 = iVar28 + 1;
                            } while (bVar60);
                          }
                        }
                      }
                      else {
                        dVar68 = ABS(dVar67);
                        if (dVar65 <= dVar68) {
                          if (dVar68 <= dVar65) goto LAB_004a64af;
                          iVar28 = iVar51;
                          do {
                            if (iVar52 <= iVar47) {
                              pdVar22 = (double *)
                                        ((((long)iVar28 * 8 + lVar42) * lVar25 + lVar19) * lVar33 +
                                        (long)local_220);
                              pdVar54 = (double *)
                                        ((((long)iVar28 * 8 + lVar43) * lVar26 + lVar37) * lVar34 +
                                        (long)local_228);
                              lVar59 = lVar18;
                              do {
                                if (iVar57 <= iVar40) {
                                  lVar55 = 0;
                                  do {
                                    pdVar22[lVar55] =
                                         (double)(-(ulong)(pdVar54[lVar55] < 0.0) &
                                                 (ulong)(ABS(pdVar54[lVar55]) * (dVar65 / dVar68)));
                                    lVar55 = lVar55 + 1;
                                  } while (iVar48 != (int)lVar55);
                                }
                                lVar59 = lVar59 + 1;
                                pdVar22 = pdVar22 + lVar33;
                                pdVar54 = pdVar54 + lVar34;
                              } while (iVar32 != (int)lVar59);
                            }
                            bVar60 = iVar28 != iVar46;
                            iVar28 = iVar28 + 1;
                          } while (bVar60);
                        }
                        else {
                          iVar28 = iVar51;
                          do {
                            if (iVar52 <= iVar47) {
                              pdVar22 = (double *)
                                        ((((long)iVar28 * 8 + lVar42) * lVar25 + lVar19) * lVar33 +
                                        (long)local_220);
                              pdVar54 = (double *)
                                        ((((long)iVar28 * 8 + lVar43) * lVar26 + lVar37) * lVar34 +
                                        (long)local_228);
                              lVar59 = lVar18;
                              do {
                                if (iVar57 <= iVar40) {
                                  lVar55 = 0;
                                  do {
                                    if (pdVar54[lVar55] < 0.0) {
                                      pdVar22[lVar55] = -pdVar54[lVar55];
                                    }
                                    if (dVar66 <= 0.0) {
                                      dVar67 = pdVar22[lVar55] + (dVar65 - dVar68) / dVar64;
LAB_004a63c0:
                                      pdVar22[lVar55] = dVar67;
                                    }
                                    else if (0.0 < pdVar54[lVar55]) {
                                      dVar67 = pdVar54[lVar55] * ((dVar65 - dVar68) / dVar66);
                                      goto LAB_004a63c0;
                                    }
                                    lVar55 = lVar55 + 1;
                                  } while (iVar48 != (int)lVar55);
                                }
                                lVar59 = lVar59 + 1;
                                pdVar22 = pdVar22 + lVar33;
                                pdVar54 = pdVar54 + lVar34;
                              } while (iVar32 != (int)lVar59);
                            }
                            bVar60 = iVar28 != iVar46;
                            iVar28 = iVar28 + 1;
                          } while (bVar60);
                        }
                      }
                    }
                  }
                  uVar63 = uVar63 + 1;
                  local_188 = local_188 + lVar44 * 8;
                  local_190 = local_190 + lVar36 * 8;
                  local_220 = local_220 + lVar44;
                  local_228 = local_228 + lVar36;
                } while (uVar63 != ncomp - 1);
              }
              if (iVar51 <= iVar46) {
                iVar48 = iVar51;
                do {
                  if (iVar52 <= iVar47) {
                    pdVar22 = (double *)
                              ((long)pdVar10 +
                              ((lVar42 + (long)iVar48 * 8) * lVar25 + lVar19) * lVar33 +
                              lVar20 * 8 + lVar41 * -8);
                    lVar55 = (iVar48 - iVar1) * lVar53;
                    lVar59 = lVar18;
                    do {
                      if (iVar57 <= iVar40) {
                        lVar31 = (lVar59 - lVar50) * lVar33;
                        pdVar54 = pdVar22;
                        lVar21 = (long)iVar57;
                        do {
                          pdVar10[lVar55 + lVar31 + (lVar21 - lVar41)] = 0.0;
                          if (2 < ncomp) {
                            dVar64 = 0.0;
                            pdVar39 = pdVar54;
                            lVar56 = (ulong)(ncomp - 1) - 1;
                            do {
                              dVar64 = dVar64 + *pdVar39;
                              pdVar10[lVar55 + lVar31 + (lVar21 - lVar41)] = dVar64;
                              pdVar39 = pdVar39 + lVar44;
                              lVar56 = lVar56 + -1;
                            } while (lVar56 != 0);
                          }
                          lVar21 = lVar21 + 1;
                          pdVar54 = pdVar54 + 1;
                        } while (iVar40 + 1 != (int)lVar21);
                      }
                      lVar59 = lVar59 + 1;
                      pdVar22 = pdVar22 + lVar33;
                    } while (iVar32 != (int)lVar59);
                  }
                  bVar60 = iVar48 != iVar46;
                  iVar48 = iVar48 + 1;
                } while (bVar60);
              }
              iVar35 = iVar35 + iVar7;
              iVar29 = iVar29 + iVar7;
              bVar60 = iVar12 != local_68 + -1;
              iVar12 = iVar12 + 1;
            } while (bVar60);
          }
          iVar30 = iVar30 + iVar8;
          bVar60 = iVar15 != local_64 + -1;
          iVar15 = iVar15 + 1;
        } while (bVar60);
      }
      iVar45 = iVar45 + iVar9;
      bVar60 = local_6c != local_60 + -1;
      local_6c = local_6c + 1;
    } while (bVar60);
  }
  return;
}

Assistant:

void
CellConservativeProtected::protect (const FArrayBox& /*crse*/,
                                    int              /*crse_comp*/,
                                    FArrayBox&       fine,
                                    int              /*fine_comp*/,
                                    FArrayBox&       fine_state,
                                    int              /*state_comp*/,
                                    int              ncomp,
                                    const Box&       fine_region,
                                    const IntVect&   ratio,
                                    const Geometry&  crse_geom,
                                    const Geometry&  fine_geom,
                                    Vector<BCRec>&   /*bcr*/,
                                    RunOn            runon)
{
#if (AMREX_SPACEDIM == 1)
    amrex::ignore_unused(fine,fine_state,
                         ncomp,fine_region,ratio,
                         crse_geom,fine_geom,runon);
    amrex::Abort("1D CellConservativeProtected::protect not supported");
#else
    BL_PROFILE("CellConservativeProtected::protect()");

    //
    // Make box which is intersection of fine_region and domain of fine.
    //
    Box target_fine_region = fine_region & fine.box();

    //
    // crse_bx is coarsening of target_fine_region, grown by 1.
    //
    Box crse_bx = CoarseBox(target_fine_region,ratio);

    //
    // cs_bx is coarsening of target_fine_region.
    //
    Box cs_bx(crse_bx);
    cs_bx.grow(-1);

#if (AMREX_SPACEDIM == 2)
    /*
     * Get coarse and fine geometry data.
     */
    GeometryData cs_geomdata = crse_geom.data();
    GeometryData fn_geomdata = fine_geom.data();
#else
    amrex::ignore_unused(crse_geom, fine_geom);
#endif

    // Extract box from fine fab
    const Box& fnbx = fine.box();

    // Extract pointers to fab data
    Array4<Real>       const&   fnarr = fine.array();
    Array4<Real const> const& fnstarr = fine_state.const_array();

    /*
     * Loop over coarse indices.
     */
#if (AMREX_SPACEDIM == 2)
    AMREX_HOST_DEVICE_PARALLEL_FOR_3D_FLAG(runon, cs_bx, ic, jc, kc,
    {
        ccprotect_2d(ic, jc, kc, ncomp,
                     fnbx, ratio,
                     cs_geomdata, fn_geomdata,
                     fnarr, fnstarr);
    }); // cs_bx
#else
    AMREX_HOST_DEVICE_PARALLEL_FOR_3D_FLAG(runon, cs_bx, ic, jc, kc,
    {
        ccprotect_3d(ic, jc, kc, ncomp,
                     fnbx, ratio,
                     fnarr, fnstarr);
    }); // cs_bx
#endif

#endif /*(AMREX_SPACEDIM == 1)*/

}